

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int asn1_write_tagged_int(uchar **p,uchar *start,int val,int tag)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  size_t local_30;
  size_t len;
  int tag_local;
  int val_local;
  uchar *start_local;
  uchar **p_local;
  
  local_30 = 0;
  sVar2 = local_30;
  len._4_4_ = val;
  do {
    local_30 = sVar2;
    if ((long)*p - (long)start < 1) {
      return -0x6c;
    }
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)len._4_4_;
    len._4_4_ = len._4_4_ >> 8;
    sVar2 = local_30 + 1;
  } while (0 < len._4_4_);
  if ((**p & 0x80) != 0) {
    if ((long)*p - (long)start < 1) {
      return -0x6c;
    }
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    sVar2 = local_30 + 2;
  }
  local_30 = sVar2;
  iVar3 = mbedtls_asn1_write_len_and_tag(p,start,local_30,(uchar)tag);
  return iVar3;
}

Assistant:

static int asn1_write_tagged_int(unsigned char **p, const unsigned char *start, int val, int tag)
{
    size_t len = 0;

    do {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        len += 1;
        *--(*p) = val & 0xff;
        val >>= 8;
    } while (val > 0);

    if (**p & 0x80) {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }
        *--(*p) = 0x00;
        len += 1;
    }

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}